

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range.h
# Opt level: O0

iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *
llvm::make_range<llvm::AppleAcceleratorTable::ValueIterator>
          (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *__return_storage_ptr__,
          ValueIterator *x,ValueIterator *y)

{
  ValueIterator local_1b0;
  ValueIterator local_e8;
  ValueIterator *local_20;
  ValueIterator *y_local;
  ValueIterator *x_local;
  
  local_20 = y;
  y_local = x;
  x_local = &__return_storage_ptr__->begin_iterator;
  AppleAcceleratorTable::ValueIterator::ValueIterator(&local_e8,x);
  AppleAcceleratorTable::ValueIterator::ValueIterator(&local_1b0,y);
  iterator_range<llvm::AppleAcceleratorTable::ValueIterator>::iterator_range
            (__return_storage_ptr__,&local_e8,&local_1b0);
  AppleAcceleratorTable::ValueIterator::~ValueIterator(&local_1b0);
  AppleAcceleratorTable::ValueIterator::~ValueIterator(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

iterator_range<T> make_range(T x, T y) {
  return iterator_range<T>(std::move(x), std::move(y));
}